

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction_selection.cpp
# Opt level: O1

shared_ptr<mocker::nasm::MemoryAddr> __thiscall
mocker::anon_unknown_0::FuncSelectionContext::buildMemAddr
          (FuncSelectionContext *this,shared_ptr<mocker::ir::Reg> *addr)

{
  undefined8 *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  shared_ptr<mocker::nasm::MemoryAddr> sVar2;
  undefined1 local_29;
  undefined8 local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_10;
  
  local_28 = *in_RDX;
  local_20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX[1];
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_20->_M_use_count = local_20->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_20->_M_use_count = local_20->_M_use_count + 1;
    }
  }
  getIrAddr((FuncSelectionContext *)&stack0xffffffffffffffe8,(shared_ptr<mocker::ir::Addr> *)addr);
  (this->irRegAddr).mp._M_h._M_buckets = (__buckets_ptr)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<mocker::nasm::MemoryAddr,std::allocator<mocker::nasm::MemoryAddr>,std::shared_ptr<mocker::nasm::Addr>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &(this->irRegAddr).mp._M_h._M_bucket_count,(MemoryAddr **)this,
             (allocator<mocker::nasm::MemoryAddr> *)&local_29,
             (shared_ptr<mocker::nasm::Addr> *)&stack0xffffffffffffffe8);
  _Var1._M_pi = extraout_RDX;
  if (local_10._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_10._M_pi);
    _Var1._M_pi = extraout_RDX_00;
  }
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
    _Var1._M_pi = extraout_RDX_01;
  }
  sVar2.super___shared_ptr<mocker::nasm::MemoryAddr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  sVar2.super___shared_ptr<mocker::nasm::MemoryAddr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mocker::nasm::MemoryAddr>)
         sVar2.super___shared_ptr<mocker::nasm::MemoryAddr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<nasm::MemoryAddr>
  buildMemAddr(const std::shared_ptr<ir::Reg> &addr) const {
    // TODO
    return std::make_shared<nasm::MemoryAddr>(getIrAddr(addr));
  }